

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::
call_matcher<int_&(int_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<int_&>,_int>_>_>
::run_actions(call_matcher<int_&(int_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<int_&>,_int>_>_>
              *this,call_params_type_t<int_&(int_&)> *params,
             call_matcher_list<int_&(int_&)> *saturated_list)

{
  trompeloeil *this_00;
  char *name;
  char *pcVar1;
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *plVar2;
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *plVar3;
  list_elem<trompeloeil::side_effect_base<int_&(int_&)>_> *plVar4;
  int iVar5;
  ulong uVar6;
  sequence_handler_base *psVar7;
  string *in_R8;
  side_effect_base<int_&(int_&)> *a;
  location loc;
  unique_lock<std::recursive_mutex> lock;
  string local_50;
  
  if (((this->sequences)._M_t.
       super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
       .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl)->max_calls
      == 0) {
    this->reported = true;
    this_00 = (trompeloeil *)(this->super_call_matcher_base<int_&(int_&)>).name;
    name = (this->super_call_matcher_base<int_&(int_&)>).loc.file;
    pcVar1 = (char *)(this->super_call_matcher_base<int_&(int_&)>).loc.line;
    params_string<int&>(&local_50,(trompeloeil *)params,(tuple<int_&> *)saturated_list);
    loc.line = (unsigned_long)&local_50;
    loc.file = pcVar1;
    report_forbidden_call(this_00,name,loc,in_R8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  get_lock<void>();
  iVar5 = (*((this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl)->
            _vptr_sequence_handler_base[3])();
  if ((char)iVar5 == '\0') {
    psVar7 = (this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
    (*psVar7->_vptr_sequence_handler_base[2])
              (psVar7,0,(this->super_call_matcher_base<int_&(int_&)>).name,
               (this->super_call_matcher_base<int_&(int_&)>).loc.file,
               (this->super_call_matcher_base<int_&(int_&)>).loc.line);
  }
  psVar7 = (this->sequences)._M_t.
           super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
           .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
  uVar6 = psVar7->call_count + 1;
  psVar7->call_count = uVar6;
  if (psVar7->min_calls <= uVar6) {
    (*psVar7->_vptr_sequence_handler_base[6])();
    psVar7 = (this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
    uVar6 = psVar7->call_count;
  }
  if (uVar6 == psVar7->max_calls) {
    (*psVar7->_vptr_sequence_handler_base[5])();
    plVar2 = (this->super_call_matcher_base<int_&(int_&)>).
             super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.next;
    plVar3 = (this->super_call_matcher_base<int_&(int_&)>).
             super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev;
    plVar2->prev = plVar3;
    plVar3->next = plVar2;
    (this->super_call_matcher_base<int_&(int_&)>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *)this;
    plVar2 = (saturated_list->
             super_list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>)
             .super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev;
    (this->super_call_matcher_base<int_&(int_&)>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev = plVar2;
    (this->super_call_matcher_base<int_&(int_&)>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *)saturated_list;
    plVar2->next = (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *)this;
    (saturated_list->
    super_list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *)this;
  }
  plVar4 = &(this->actions).super_list_elem<trompeloeil::side_effect_base<int_&(int_&)>_>;
  while (plVar4 = plVar4->next,
        plVar4 != &(this->actions).super_list_elem<trompeloeil::side_effect_base<int_&(int_&)>_>) {
    (*plVar4->_vptr_list_elem[2])(plVar4,params);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_50);
  return;
}

Assistant:

void
    run_actions(
      call_params_type_t<Sig>& params,
      call_matcher_list<Sig> &saturated_list)
    override
    {
      if (sequences->is_forbidden())
      {
        reported = true;
        report_forbidden_call(name, loc, params_string(params));
      }
      auto lock = get_lock();
      {
        if (!sequences->can_be_called())
        {
          sequences->validate(severity::fatal, name, loc);
        }
        sequences->increment_call();
        if (sequences->is_satisfied())
        {
          sequences->retire_predecessors();
        }
        if (sequences->is_saturated())
        {
          sequences->retire();
          this->unlink();
          saturated_list.push_back(this);
        }
      }
      for (auto& a : actions) a.action(params);
    }